

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O3

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_order_cancel *m)

{
  order_book *this_00;
  iterator iVar1;
  undefined8 uVar2;
  long lVar3;
  uint64_t uVar4;
  uint64_t order_id;
  uint64_t local_58;
  event local_50;
  
  lVar3 = 1;
  local_58 = 0;
  while (m->OrderReferenceNumber[lVar3 + -1] == ' ') {
    lVar3 = lVar3 + 1;
    if (lVar3 == 10) goto LAB_00117af8;
  }
  local_58 = 0;
  for (; lVar3 != 10; lVar3 = lVar3 + 1) {
    local_58 = ((long)m->OrderReferenceNumber[lVar3 + -1] + local_58 * 10) - 0x30;
  }
LAB_00117af8:
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book_&>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_id_map)._M_h,&local_58);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false>.
      _M_cur == (__node_type *)0x0) {
    return;
  }
  uVar4 = 0;
  lVar3 = 0;
  while (m->CanceledQuantity[lVar3] == ' ') {
    lVar3 = lVar3 + 1;
    if (lVar3 == 9) goto LAB_00117b25;
  }
  uVar4 = 0;
  for (; lVar3 != 9; lVar3 = lVar3 + 1) {
    uVar4 = ((long)m->CanceledQuantity[lVar3] + uVar4 * 10) - 0x30;
  }
LAB_00117b25:
  this_00 = *(order_book **)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false>
                    ._M_cur + 0x10);
  order_book::cancel(this_00,local_58,uVar4);
  uVar4 = this->time_sec * 1000 + this->time_msec;
  this_00->_timestamp = uVar4;
  make_ob_event(&local_50,&this_00->_symbol,uVar4,this_00,0);
  if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar2 = std::__throw_bad_function_call();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._symbol._M_dataplus._M_p != &local_50._symbol.field_2) {
      operator_delete(local_50._symbol._M_dataplus._M_p,
                      local_50._symbol.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar2);
  }
  (*(this->_process_event)._M_invoker)((_Any_data *)&this->_process_event,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._symbol._M_dataplus._M_p == &local_50._symbol.field_2) {
    return;
  }
  operator_delete(local_50._symbol._M_dataplus._M_p,
                  local_50._symbol.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_cancel* m)
{
    uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
    auto it = order_id_map.find(order_id);
    if (it != order_id_map.end()) {
        uint64_t quantity = itch_uatoi(m->CanceledQuantity, sizeof(m->CanceledQuantity));
        auto& ob = it->second;
        ob.cancel(order_id, quantity);
        ob.set_timestamp(timestamp());
        _process_event(make_ob_event(ob.symbol(), timestamp(), &ob));
    }
}